

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

float GetPredictionCostCrossColorRed
                (uint32_t *argb,int stride,int tile_width,int tile_height,VP8LMultipliers prev_x,
                VP8LMultipliers prev_y,int green_to_red,int *accumulated_red_histo)

{
  float fVar1;
  int aiStack_438 [258];
  
  memset(aiStack_438,0,0x400);
  (*VP8LCollectColorRedTransforms)(argb,stride,tile_width,tile_height,green_to_red,aiStack_438);
  fVar1 = PredictionCostCrossColor(accumulated_red_histo,aiStack_438);
  if ((green_to_red & 0xffU) == ((uint3)prev_x & 0xff)) {
    fVar1 = fVar1 + -3.0;
  }
  if ((green_to_red & 0xffU) == ((uint3)prev_y & 0xff)) {
    fVar1 = fVar1 + -3.0;
  }
  if (green_to_red == 0) {
    fVar1 = fVar1 + -3.0;
  }
  return fVar1;
}

Assistant:

static float GetPredictionCostCrossColorRed(
    const uint32_t* argb, int stride, int tile_width, int tile_height,
    VP8LMultipliers prev_x, VP8LMultipliers prev_y, int green_to_red,
    const int accumulated_red_histo[256]) {
  int histo[256] = { 0 };
  float cur_diff;

  VP8LCollectColorRedTransforms(argb, stride, tile_width, tile_height,
                                green_to_red, histo);

  cur_diff = PredictionCostCrossColor(accumulated_red_histo, histo);
  if ((uint8_t)green_to_red == prev_x.green_to_red_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if ((uint8_t)green_to_red == prev_y.green_to_red_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if (green_to_red == 0) {
    cur_diff -= 3;
  }
  return cur_diff;
}